

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::SonarQubeReporter::writeTestFile
          (SonarQubeReporter *this,StringRef filename,
          vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
          *testCaseNodes)

{
  pointer ppNVar1;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> **child;
  pointer ppNVar2;
  StringRef name;
  allocator<char> local_59;
  ScopedElement e;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"file",&local_59);
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)&this->xml,(XmlFormatting)local_48);
  std::__cxx11::string::~string(local_48);
  name.m_size = 4;
  name.m_start = "path";
  XmlWriter::writeAttribute(&this->xml,name,filename);
  ppNVar1 = (testCaseNodes->
            super__Vector_base<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppNVar2 = (testCaseNodes->
                 super__Vector_base<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
      ppNVar2 = ppNVar2 + 1) {
    writeTestCase(this,*ppNVar2);
  }
  XmlWriter::ScopedElement::~ScopedElement(&e);
  return;
}

Assistant:

void SonarQubeReporter::writeTestFile(StringRef filename, std::vector<TestCaseNode const*> const& testCaseNodes) {
        XmlWriter::ScopedElement e = xml.scopedElement("file");
        xml.writeAttribute("path"_sr, filename);

        for (auto const& child : testCaseNodes)
            writeTestCase(*child);
    }